

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Maybe<unsigned_long>_> depResult;
  Maybe<unsigned_long> local_3c0;
  NullableValue<capnp::MessageReaderAndFds> local_3b0;
  NullableValue<kj::Exception> local_388;
  char local_1f0;
  char local_1e8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_1e0;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> local_1d8;
  
  local_388.isSet = false;
  local_1f0 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_388);
  if (local_388.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1d8,&local_388.field_1.value);
    local_1d8.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::operator=
              ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)output,&local_1d8);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&local_1d8);
  }
  else if (local_1f0 == '\x01') {
    local_3c0.ptr.isSet = (bool)local_1e8;
    if (local_1e8 == '\x01') {
      local_3c0.ptr.field_1 = local_1e0;
      local_1e8 = '\0';
    }
    anon_class_32_2_fe89d4e7_for_func::operator()
              ((Maybe<capnp::MessageReaderAndFds> *)&local_3b0,&this->func,&local_3c0);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::ExceptionOr
              (&local_1d8,(Maybe<capnp::MessageReaderAndFds> *)&local_3b0);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::operator=
              ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)output,&local_1d8);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&local_1d8);
    NullableValue<capnp::MessageReaderAndFds>::~NullableValue(&local_3b0);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_388);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }